

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O0

void __thiscall vkt::sr::anon_unknown_0::ShaderDataSpec::ShaderDataSpec(ShaderDataSpec *this)

{
  ShaderValue *local_18;
  ShaderDataSpec *this_local;
  
  this->resultScale = 1.0;
  this->resultBias = 0.0;
  this->referenceScale = 1.0;
  this->referenceBias = 0.0;
  this->precision = PRECISION_LAST;
  this->output = TYPE_LAST;
  this->numInputs = 0;
  local_18 = this->inputs;
  do {
    ShaderValue::ShaderValue(local_18);
    local_18 = local_18 + 1;
  } while ((ShaderDataSpec *)local_18 != this + 1);
  return;
}

Assistant:

ShaderDataSpec (void)
		: resultScale		(1.0f)
		, resultBias		(0.0f)
		, referenceScale	(1.0f)
		, referenceBias		(0.0f)
		, precision			(PRECISION_LAST)
		, output			(TYPE_LAST)
		, numInputs			(0)
	{
	}